

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

int liq_lookup(char *name)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer plVar7;
  
  plVar1 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_start;
  plVar7 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lVar6 >> 7) {
    lVar5 = (lVar6 >> 7) + 1;
    plVar2 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
    do {
      plVar7 = plVar2;
      if (plVar7[-2].liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7[-2].liq_name);
        if (!bVar3) {
          plVar7 = plVar7 + -2;
          goto LAB_0029bbf0;
        }
      }
      if (plVar7[-1].liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7[-1].liq_name);
        if (!bVar3) {
          plVar7 = plVar7 + -1;
          goto LAB_0029bbf0;
        }
      }
      if (plVar7->liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7->liq_name);
        if (!bVar3) goto LAB_0029bbf0;
      }
      if (plVar7[1].liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7[1].liq_name);
        if (!bVar3) {
          plVar7 = plVar7 + 1;
          goto LAB_0029bbf0;
        }
      }
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x80;
      plVar2 = plVar7 + 4;
    } while (1 < lVar5);
    plVar7 = plVar7 + 2;
  }
  lVar6 = lVar6 >> 5;
  if (lVar6 == 1) {
LAB_0029bbc7:
    if (plVar7->liq_name != (char *)0x0) {
      bVar3 = str_prefix(name,plVar7->liq_name);
      if (!bVar3) goto LAB_0029bbf0;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0029bbaf:
      if (plVar7->liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7->liq_name);
        if (!bVar3) goto LAB_0029bbf0;
      }
      plVar7 = plVar7 + 1;
      goto LAB_0029bbc7;
    }
    if (lVar6 == 3) {
      if (plVar7->liq_name != (char *)0x0) {
        bVar3 = str_prefix(name,plVar7->liq_name);
        if (!bVar3) goto LAB_0029bbf0;
      }
      plVar7 = plVar7 + 1;
      goto LAB_0029bbaf;
    }
  }
  plVar7 = plVar1;
LAB_0029bbf0:
  iVar4 = (int)((ulong)((long)plVar7 -
                       (long)liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 5);
  if (plVar7 == liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int liq_lookup(const char *name)
{
	auto it = std::find_if(liq_table.begin(), liq_table.end(), [name] (auto liquid) {
		return liquid.liq_name != nullptr && !str_prefix(name, liquid.liq_name);
	});

	return it != liq_table.end()
		? it - liq_table.begin()
		: 0;
}